

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeXYZnode::ChLoadXYZnodeXYZnode
          (ChLoadXYZnodeXYZnode *this,ChLoadXYZnodeXYZnode *param_1)

{
  ChLoadCustomMultiple::ChLoadCustomMultiple
            (&this->super_ChLoadCustomMultiple,&param_1->super_ChLoadCustomMultiple);
  (this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadCustomMultiple_0116d4c8;
  (this->computed_abs_force).m_data[0] = (param_1->computed_abs_force).m_data[0];
  (this->computed_abs_force).m_data[1] = (param_1->computed_abs_force).m_data[1];
  (this->computed_abs_force).m_data[2] = (param_1->computed_abs_force).m_data[2];
  return;
}

Assistant:

class ChApi ChLoadXYZnodeXYZnode : public ChLoadCustomMultiple {
  public:
    ChLoadXYZnodeXYZnode(std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node A to apply load to
						 std::shared_ptr<ChNodeXYZ> mnodeB   ///< node B to apply load to, as reaction
    );

    /// Compute the force on the node A, in absolute coordsystem,
    /// given position and speed of node respect to the other. Node B gets the opposite.
    /// Inherited classes MUST IMPLEMENT THIS.
    virtual void ComputeForce(const ChVector<>& rel_pos,
							  const ChVector<>& rel_vel,
                              ChVector<>& abs_force) = 0;

	// Optional: inherited classes could implement this to avoid the
    // default numerical computation of jacobians:
    //   virtual void ComputeJacobian(...) // see ChLoad

    /// Compute Q, the generalized load.
    /// Called automatically at each Update().
    virtual void ComputeQ(ChState* state_x,      ///< state position to evaluate Q
                          ChStateDelta* state_w  ///< state speed to evaluate Q
                          ) override;

	/// For diagnosis purposes, this can return the actual last computed value of
    /// the applied force, expressed in absolute coordinate system, assumed applied to node
    ChVector<> GetForce() const { return computed_abs_force; }

  protected:

	/// Inherited classes could override this and return true, if the load benefits from a jacobian
	/// when using implicit integrators. 
    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;

	ChVector<> computed_abs_force;
}